

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void CfdcapiPsbtDumpLog(int result,void *handle)

{
  bool bVar1;
  char *message;
  int in_EDI;
  AssertionResult gtest_ar;
  int ret;
  char *output;
  AssertHelper local_50 [3];
  Message local_38;
  AssertionResult local_30;
  int local_1c;
  char *local_18;
  
  if (in_EDI != 0) {
    local_18 = (char *)0x0;
    local_1c = CfdGetLastErrorMessage(handle,(char **)output);
    if (local_1c == 0) {
      testing::internal::CmpHelperSTREQ((internal *)&local_30,"\"\"","output","",local_18);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
      if (!bVar1) {
        testing::Message::Message(&local_38);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x381aee);
        testing::internal::AssertHelper::AssertHelper
                  (local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x2d,message);
        testing::internal::AssertHelper::operator=(local_50,&local_38);
        testing::internal::AssertHelper::~AssertHelper(local_50);
        testing::Message::~Message((Message *)0x381b3a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x381b8a);
    }
  }
  return;
}

Assistant:

static void CfdcapiPsbtDumpLog(int result, void* handle) {
  if (result != kCfdSuccess) {
    char* output = nullptr;
    int ret = CfdGetLastErrorMessage(handle, &output);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("", output);
    }
  }
}